

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O3

bool __thiscall GGWave::computeFFTR(GGWave *this,float *src,float *dst,int N)

{
  uint uVar1;
  int *ip;
  float *w;
  
  uVar1 = this->m_samplesPerFrame;
  if (uVar1 == N) {
    ip = (this->m_rx).fftWorkI.m_data;
    w = (this->m_rx).fftWorkF.m_data;
    memcpy(dst,src,(long)N << 2);
    rdft(N,1,dst,ip,w);
  }
  else if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
    fprintf((anonymous_namespace)::g_fptr,
            "computeFFTR: N (%d) must be equal to \'samplesPerFrame\' %d\n",(ulong)(uint)N,
            (ulong)uVar1);
  }
  return uVar1 == N;
}

Assistant:

bool GGWave::computeFFTR(const float * src, float * dst, int N) {
    if (N != m_samplesPerFrame) {
        ggprintf("computeFFTR: N (%d) must be equal to 'samplesPerFrame' %d\n", N, m_samplesPerFrame);
        return false;
    }

    FFT(src, dst, N, m_rx.fftWorkI.data(), m_rx.fftWorkF.data());

    return true;
}